

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int __thiscall re2::RE2::ReverseProgramSize(RE2 *this)

{
  Prog *this_00;
  Prog *prog;
  RE2 *this_local;
  
  if (this->prog_ == (Prog *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    this_00 = ReverseProg(this);
    if (this_00 == (Prog *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = Prog::size(this_00);
    }
  }
  return this_local._4_4_;
}

Assistant:

int RE2::ReverseProgramSize() const {
  if (prog_ == NULL)
    return -1;
  Prog* prog = ReverseProg();
  if (prog == NULL)
    return -1;
  return prog->size();
}